

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

void __thiscall capnp::_::OrphanBuilder::truncateText(OrphanBuilder *this,ElementCount size)

{
  int iVar1;
  undefined4 in_register_00000034;
  OrphanBuilder OStack_38;
  
  iVar1 = truncate(this,(char *)CONCAT44(in_register_00000034,size),1);
  if ((char)iVar1 == '\0') {
    initText(&OStack_38,(BuilderArena *)(this->segment->super_SegmentReader).arena,this->capTable,
             size);
    operator=(this,&OStack_38);
    ~OrphanBuilder(&OStack_38);
  }
  return;
}

Assistant:

void OrphanBuilder::truncateText(ElementCount size) {
  if (!truncate(size, true)) {
    // assumeBits() safe since it's checked inside truncate()
    *this = initText(segment->getArena(), capTable,
        assumeBits<LIST_ELEMENT_COUNT_BITS>(size) * (ONE * BYTES / ELEMENTS));
  }
}